

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_siblings.h
# Opt level: O2

void __thiscall
Gudhi::
Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>,std::less<int>,void>>
::
Simplex_tree_siblings<std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>>
          (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>,std::less<int>,void>>
           *this,Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
                 *oncles,Vertex_handle parent,
          vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
          *members)

{
  pointer bg;
  reference ppVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar2;
  iterator __begin0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>
  local_20;
  
  *(Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
    **)this = oncles;
  *(Vertex_handle *)(this + 8) = parent;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>
  ::
  flat_tree<__gnu_cxx::__normal_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>const*,std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>>>
            ((flat_tree<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>,boost::container::dtl::select1st<int>,std::less<int>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>>>
              *)(this + 0x10),
             (members->
             super__Vector_base<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (members->
             super__Vector_base<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_20.m_ptr =
       *(pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
         **)(this + 0x10);
  ppVar2 = local_20.m_ptr + *(long *)(this + 0x18);
  while (local_20.m_ptr != ppVar2) {
    ppVar1 = boost::container::
             vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>
             ::operator*(&local_20);
    (ppVar1->second).children_ = (Siblings *)this;
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_false>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

Simplex_tree_siblings(Simplex_tree_siblings * oncles, Vertex_handle parent, const RandomAccessVertexRange & members)
      : oncles_(oncles),
        parent_(parent),
        members_(boost::container::ordered_unique_range, members.begin(),
                 members.end()) {
    for (auto& map_el : members_) {
      map_el.second.assign_children(this);
    }
  }